

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench.cc
# Opt level: O3

void __thiscall leveldb::Benchmark::DoDelete(Benchmark *this,ThreadState *thread,bool seq)

{
  int iVar1;
  undefined8 uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Benchmark *this_00;
  undefined1 auVar8 [16];
  Cache *pCVar9;
  WriteBatch batch;
  RandomGenerator gen;
  char key [100];
  undefined1 local_f8 [16];
  DB *local_e8;
  WriteBatch local_e0;
  RandomGenerator local_c0;
  FilterPolicy local_98 [13];
  
  anon_unknown_0::RandomGenerator::RandomGenerator(&local_c0);
  WriteBatch::WriteBatch(&local_e0);
  if (0 < this->num_) {
    iVar7 = 0;
    do {
      WriteBatch::Clear(&local_e0);
      if (0 < this->entries_per_batch_) {
        iVar6 = 0;
        do {
          if (seq) {
            uVar4 = (ulong)(uint)(iVar6 + iVar7);
          }
          else {
            uVar4 = (ulong)(thread->rand).seed_ * 0x41a7;
            uVar3 = (uint)uVar4 & 0x7fffffff;
            iVar1 = (int)(uVar4 >> 0x1f);
            uVar5 = iVar1 + uVar3;
            uVar3 = iVar1 + uVar3 + 0x80000001;
            if (-1 < (int)uVar5) {
              uVar3 = uVar5;
            }
            (thread->rand).seed_ = uVar3;
            uVar4 = (ulong)uVar3 % (ulong)(uint)FLAGS_num;
          }
          snprintf((char *)local_98,100,"%016d",uVar4);
          local_f8._8_8_ = local_98;
          local_e8 = (DB *)strlen((char *)local_98);
          WriteBatch::Delete(&local_e0,(Slice *)(local_f8 + 8));
          anon_unknown_0::Stats::FinishedSingleOp(&thread->stats);
          iVar6 = iVar6 + 1;
        } while (iVar6 < this->entries_per_batch_);
      }
      (*this->db_->_vptr_DB[4])(local_98,this->db_,&this->write_options_,&local_e0);
      local_f8._0_8_ = local_98[0]._vptr_FilterPolicy;
      if (local_98[0]._vptr_FilterPolicy != (_func_int **)0x0) {
        this_00 = (Benchmark *)local_f8;
        DoDelete(this_00);
        this_00->value_size_ = 100;
        Histogram::Clear((Histogram *)(this_00 + 1));
        this_00->num_ = 0;
        this_00->entries_per_batch_ = 0;
        this_00->write_options_ = false;
        *(undefined3 *)&this_00->field_0x25 = 0;
        this_00->db_ = (DB *)0x0;
        this_00[0x1b].entries_per_batch_ = 0;
        this_00[0x1b].write_options_ = false;
        *(undefined3 *)&this_00[0x1b].field_0x25 = 0;
        **(undefined1 **)&this_00[0x1b].num_ = 0;
        uVar2 = (**(code **)(*(anonymous_namespace)::g_env + 0xa8))();
        auVar8._8_4_ = (int)((ulong)uVar2 >> 0x20);
        auVar8._0_8_ = uVar2;
        auVar8._12_4_ = 0x45300000;
        pCVar9 = (Cache *)((auVar8._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0));
        *(Cache **)&this_00->reads_ = pCVar9;
        this_00->filter_policy_ = (FilterPolicy *)pCVar9;
        this_00->cache_ = pCVar9;
        return;
      }
      iVar7 = iVar7 + this->entries_per_batch_;
    } while (iVar7 < this->num_);
  }
  WriteBatch::~WriteBatch(&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.data_._M_dataplus._M_p != &local_c0.data_.field_2) {
    operator_delete(local_c0.data_._M_dataplus._M_p);
  }
  return;
}

Assistant:

void DoDelete(ThreadState* thread, bool seq) {
    RandomGenerator gen;
    WriteBatch batch;
    Status s;
    for (int i = 0; i < num_; i += entries_per_batch_) {
      batch.Clear();
      for (int j = 0; j < entries_per_batch_; j++) {
        const int k = seq ? i + j : (thread->rand.Next() % FLAGS_num);
        char key[100];
        std::snprintf(key, sizeof(key), "%016d", k);
        batch.Delete(key);
        thread->stats.FinishedSingleOp();
      }
      s = db_->Write(write_options_, &batch);
      if (!s.ok()) {
        std::fprintf(stderr, "del error: %s\n", s.ToString().c_str());
        std::exit(1);
      }
    }
  }